

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O3

PmError Pm_OpenInput(PortMidiStream **stream,PmDeviceID inputDevice,void *inputDriverInfo,
                    int32_t bufferSize,PmTimeProcPtr time_proc,void *time_info)

{
  pm_fns_type ppVar1;
  descriptor_type paVar2;
  PmError PVar3;
  pm_internal_struct *ptr;
  PmQueue *pPVar4;
  PmError PVar5;
  ulong num_msgs;
  
  pm_hosterror = 0;
  *stream = (PortMidiStream *)0x0;
  PVar5 = pmInvalidDeviceId;
  if ((-1 < inputDevice) && (inputDevice < pm_descriptor_index)) {
    if ((descriptors[(uint)inputDevice].pub.input != 0) &&
       (descriptors[(uint)inputDevice].pub.opened == 0)) {
      ptr = (pm_internal_struct *)pm_alloc(0x78);
      *stream = ptr;
      PVar5 = pmInsufficientMemory;
      if (ptr != (pm_internal_struct *)0x0) {
        ptr->device_id = inputDevice;
        ptr->write_flag = 0;
        ptr->time_proc = time_proc;
        ptr->time_info = time_info;
        num_msgs = 0x100;
        if (0 < bufferSize) {
          num_msgs = (ulong)(uint)bufferSize;
        }
        pPVar4 = Pm_QueueCreate(num_msgs,8);
        ptr->queue = pPVar4;
        if (pPVar4 == (PmQueue *)0x0) {
          *stream = (PortMidiStream *)0x0;
          pm_free(ptr);
        }
        else {
          ptr->buffer_len = (int32_t)num_msgs;
          ptr->latency = 0;
          ptr->sysex_in_progress = 0;
          ptr->sysex_message = 0;
          ptr->sysex_message_count = 0;
          ptr->filters = 0x4000;
          ptr->channel_mask = 0xffff;
          PVar5 = pmNoData;
          ptr->sync_time = 0;
          ptr->first_message = 1;
          paVar2 = descriptors;
          ppVar1 = descriptors[(uint)inputDevice].dictionary;
          ptr->dictionary = ppVar1;
          ptr->fill_base = (uchar *)0x0;
          ptr->fill_offset_ptr = (uint32_t *)0x0;
          ptr->fill_length = 0;
          paVar2[(uint)inputDevice].internalDescriptor = ptr;
          PVar3 = (*ppVar1->open)(ptr,inputDriverInfo);
          if (PVar3 == pmNoData) {
            descriptors[(uint)inputDevice].pub.opened = 1;
          }
          else {
            *stream = (PortMidiStream *)0x0;
            descriptors[(uint)inputDevice].internalDescriptor = (void *)0x0;
            Pm_QueueDestroy(ptr->queue);
            pm_free(ptr);
            PVar5 = PVar3;
          }
        }
      }
    }
  }
  return PVar5;
}

Assistant:

PMEXPORT PmError Pm_OpenInput(PortMidiStream** stream,
                     PmDeviceID inputDevice,
                     void *inputDriverInfo,
                     int32_t bufferSize,
                     PmTimeProcPtr time_proc,
                     void *time_info)
{
    PmInternal *midi;
    PmError err = pmNoError;
    pm_hosterror = FALSE;
    *stream = NULL;
    
    /* arg checking */
    if (inputDevice < 0 || inputDevice >= pm_descriptor_index) 
        err = pmInvalidDeviceId;
    else if (!descriptors[inputDevice].pub.input) 
        err =  pmInvalidDeviceId;
    else if(descriptors[inputDevice].pub.opened)
        err =  pmInvalidDeviceId;
    
    if (err != pmNoError) 
        goto error_return;

    /* create portMidi internal data */
    midi = (PmInternal *) pm_alloc(sizeof(PmInternal)); 
    *stream = midi;
    if (!midi) {
        err = pmInsufficientMemory;
        goto error_return;
    }
    midi->device_id = inputDevice;
    midi->write_flag = FALSE;
    midi->time_proc = time_proc;
    midi->time_info = time_info;
    /* windows adds timestamps in the driver and these are more accurate than
       using a time_proc, so do not automatically provide a time proc. Non-win
       implementations may want to provide a default time_proc in their
       system-specific midi_out_open() method.
     */
    if (bufferSize <= 0) bufferSize = 256; /* default buffer size */
    midi->queue = Pm_QueueCreate(bufferSize, (int32_t) sizeof(PmEvent));
    if (!midi->queue) {
        /* free portMidi data */
        *stream = NULL;
        pm_free(midi); 
        err = pmInsufficientMemory;
        goto error_return;
    }
    midi->buffer_len = bufferSize; /* portMidi input storage */
    midi->latency = 0; /* not used */
    midi->sysex_in_progress = FALSE;
    midi->sysex_message = 0; 
    midi->sysex_message_count = 0; 
    midi->filters = PM_FILT_ACTIVE;
    midi->channel_mask = 0xFFFF;
    midi->sync_time = 0;
    midi->first_message = TRUE;
    midi->dictionary = descriptors[inputDevice].dictionary;
    midi->fill_base = NULL;
    midi->fill_offset_ptr = NULL;
    midi->fill_length = 0;
    descriptors[inputDevice].internalDescriptor = midi;
    /* open system dependent input device */
    err = (*midi->dictionary->open)(midi, inputDriverInfo);
    if (err) {
        *stream = NULL;
        descriptors[inputDevice].internalDescriptor = NULL;
        /* free portMidi data */
        Pm_QueueDestroy(midi->queue);
        pm_free(midi);
    } else {
        /* portMidi input open successful */
        descriptors[inputDevice].pub.opened = TRUE;
    }
error_return:
    /* note: if there is a pmHostError, it is the responsibility
     * of the system-dependent code (*midi->dictionary->open)()
     * to set pm_hosterror and pm_hosterror_text
     */
    return pm_errmsg(err);
}